

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O3

void __thiscall Fl_Browser_::resize(Fl_Browser_ *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  int X_00;
  int W_00;
  int iVar3;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  W_00 = this->scrollbar_size_;
  local_44 = H;
  local_3c = W;
  local_38 = Y;
  local_34 = X;
  if (W_00 == 0) {
    W_00 = Fl::scrollbar_size();
  }
  Fl_Widget::resize((Fl_Widget *)this,X,Y,W,H);
  bbox(this,&local_34,&local_38,&local_3c,&local_44);
  X_00 = local_34;
  iVar2 = local_38;
  iVar1 = local_44;
  local_40 = local_3c;
  iVar3 = -W_00;
  if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 4) == 0)
  {
    iVar3 = local_3c;
  }
  Fl_Widget::resize((Fl_Widget *)&this->scrollbar,iVar3 + local_34,local_38,W_00,local_44);
  iVar3 = -W_00;
  if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 1) == 0)
  {
    iVar3 = iVar1;
  }
  Fl_Widget::resize((Fl_Widget *)&this->hscrollbar,X_00,iVar3 + iVar2,local_40,W_00);
  this->max_width = 0;
  return;
}

Assistant:

void Fl_Browser_::resize(int X, int Y, int W, int H) {
  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  Fl_Widget::resize(X, Y, W, H);
  // move the scrollbars so they can respond to events:
  bbox(X,Y,W,H);
  scrollbar.resize(
	scrollbar.align()&FL_ALIGN_LEFT ? X-scrollsize : X+W,
	Y, scrollsize, H);
  hscrollbar.resize(
	X, scrollbar.align()&FL_ALIGN_TOP ? Y-scrollsize : Y+H,
	W, scrollsize);
  max_width = 0;
}